

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void dradfg(int ido,int ip,int l1,int idl1,float *cc,float *c1,float *c2,float *ch,float *ch2,
           float *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  int ipp2;
  int idp2;
  float ar2h;
  float ar1h;
  float dsp;
  float arg;
  float dcp;
  int nbd;
  float ds2;
  float ar2;
  float ar1;
  float ai2;
  float ai1;
  float dc2;
  int t10;
  int t9;
  int t8;
  int t7;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int is;
  int ik;
  int ic;
  int l;
  int k;
  int j;
  int i;
  int ipph;
  int idij;
  float *c1_local;
  float *cc_local;
  int idl1_local;
  int l1_local;
  int ip_local;
  int ido_local;
  
  fVar7 = dradfg::tpi / (float)ip;
  dVar9 = cos((double)fVar7);
  dVar10 = sin((double)fVar7);
  iVar1 = ip + 1 >> 1;
  iVar2 = ido + -1 >> 1;
  iVar3 = l1 * ido;
  iVar4 = ip * ido;
  if (ido != 1) {
    for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
      ch2[t0] = c2[t0];
    }
    t3 = 0;
    for (l = 1; l < ip; l = l + 1) {
      t3 = iVar3 + t3;
      t4 = t3;
      for (ic = 0; ic < l1; ic = ic + 1) {
        ch[t4] = c1[t4];
        t4 = ido + t4;
      }
    }
    t1 = -ido;
    t3 = 0;
    if (l1 < iVar2) {
      for (l = 1; l < ip; l = l + 1) {
        t3 = iVar3 + t3;
        t1 = ido + t1;
        t4 = t3 - ido;
        for (ic = 0; ic < l1; ic = ic + 1) {
          t4 = ido + t4;
          t5 = t4;
          i = t1 + -1;
          for (k = 2; k < ido; k = k + 2) {
            iVar6 = i + 2;
            iVar5 = t5 + 2;
            ch[t5 + 1] = wa[i + 1] * c1[t5 + 1] + wa[iVar6] * c1[iVar5];
            ch[iVar5] = wa[i + 1] * c1[iVar5] + -(wa[iVar6] * c1[t5 + 1]);
            t5 = iVar5;
            i = iVar6;
          }
        }
      }
    }
    else {
      for (l = 1; l < ip; l = l + 1) {
        t1 = ido + t1;
        t3 = iVar3 + t3;
        t4 = t3;
        i = t1 + -1;
        for (k = 2; k < ido; k = k + 2) {
          iVar6 = i + 2;
          t4 = t4 + 2;
          t5 = t4;
          for (ic = 0; ic < l1; ic = ic + 1) {
            ch[t5 + -1] = wa[i + 1] * c1[t5 + -1] + wa[iVar6] * c1[t5];
            ch[t5] = wa[i + 1] * c1[t5] + -(wa[iVar6] * c1[t5 + -1]);
            t5 = ido + t5;
          }
          i = iVar6;
        }
      }
    }
    t3 = 0;
    t4 = ip * iVar3;
    if (iVar2 < l1) {
      for (l = 1; l < iVar1; l = l + 1) {
        t3 = iVar3 + t3;
        t4 = t4 - iVar3;
        t6 = t4;
        t5 = t3;
        for (k = 2; k < ido; k = k + 2) {
          t5 = t5 + 2;
          t6 = t6 + 2;
          t7 = t5 - ido;
          t8 = t6 - ido;
          for (ic = 0; ic < l1; ic = ic + 1) {
            t7 = ido + t7;
            t8 = ido + t8;
            c1[t7 + -1] = ch[t7 + -1] + ch[t8 + -1];
            c1[t8 + -1] = ch[t7] - ch[t8];
            c1[t7] = ch[t7] + ch[t8];
            c1[t8] = ch[t8 + -1] - ch[t7 + -1];
          }
        }
      }
    }
    else {
      for (l = 1; l < iVar1; l = l + 1) {
        t3 = iVar3 + t3;
        t4 = t4 - iVar3;
        t6 = t4;
        t5 = t3;
        for (ic = 0; ic < l1; ic = ic + 1) {
          t7 = t5;
          t8 = t6;
          for (k = 2; k < ido; k = k + 2) {
            iVar6 = t7 + 2;
            iVar5 = t8 + 2;
            c1[t7 + 1] = ch[t7 + 1] + ch[t8 + 1];
            c1[t8 + 1] = ch[iVar6] - ch[iVar5];
            c1[iVar6] = ch[iVar6] + ch[iVar5];
            c1[iVar5] = ch[t8 + 1] - ch[t7 + 1];
            t8 = iVar5;
            t7 = iVar6;
          }
          t5 = ido + t5;
          t6 = ido + t6;
        }
      }
    }
  }
  for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
    c2[t0] = ch2[t0];
  }
  t3 = 0;
  t4 = ip * idl1;
  for (l = 1; l < iVar1; l = l + 1) {
    t3 = iVar3 + t3;
    t4 = t4 - iVar3;
    t5 = t3 - ido;
    t6 = t4 - ido;
    for (ic = 0; ic < l1; ic = ic + 1) {
      t5 = ido + t5;
      t6 = ido + t6;
      c1[t5] = ch[t5] + ch[t6];
      c1[t6] = ch[t6] - ch[t5];
    }
  }
  ds2 = 1.0;
  ar1 = 0.0;
  t3 = 0;
  t4 = ip * idl1;
  for (ik = 1; ik < iVar1; ik = ik + 1) {
    t3 = idl1 + t3;
    t4 = t4 - idl1;
    fVar7 = (float)dVar9 * ds2 + -((float)dVar10 * ar1);
    ar1 = (float)dVar9 * ar1 + (float)dVar10 * ds2;
    t9 = idl1;
    t8 = (ip + -1) * idl1;
    t7 = t4;
    t6 = t3;
    for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
      ch2[t6] = fVar7 * c2[t9] + c2[t0];
      ch2[t7] = ar1 * c2[t8];
      t9 = t9 + 1;
      t8 = t8 + 1;
      t7 = t7 + 1;
      t6 = t6 + 1;
    }
    t7 = (ip + -1) * idl1;
    nbd = (int)fVar7;
    ar2 = ar1;
    t6 = idl1;
    for (l = 2; l < iVar1; l = l + 1) {
      t6 = idl1 + t6;
      t7 = t7 - idl1;
      fVar8 = fVar7 * (float)nbd + -(ar1 * ar2);
      ar2 = fVar7 * ar2 + ar1 * (float)nbd;
      dc2 = (float)t7;
      t10 = t6;
      t9 = t4;
      t8 = t3;
      for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
        ch2[t8] = fVar8 * c2[t10] + ch2[t8];
        ch2[t9] = ar2 * c2[(int)dc2] + ch2[t9];
        dc2 = (float)((int)dc2 + 1);
        t10 = t10 + 1;
        t9 = t9 + 1;
        t8 = t8 + 1;
      }
      nbd = (int)fVar8;
    }
    ds2 = fVar7;
  }
  t3 = 0;
  for (l = 1; l < iVar1; l = l + 1) {
    t3 = idl1 + t3;
    t4 = t3;
    for (t0 = 0; t0 < idl1; t0 = t0 + 1) {
      ch2[t0] = c2[t4] + ch2[t0];
      t4 = t4 + 1;
    }
  }
  if (ido < l1) {
    for (k = 0; k < ido; k = k + 1) {
      t3 = k;
      t4 = k;
      for (ic = 0; ic < l1; ic = ic + 1) {
        cc[t4] = ch[t3];
        t3 = ido + t3;
        t4 = iVar4 + t4;
      }
    }
  }
  else {
    t3 = 0;
    t4 = 0;
    for (ic = 0; ic < l1; ic = ic + 1) {
      t5 = t3;
      t6 = t4;
      for (k = 0; k < ido; k = k + 1) {
        cc[t6] = ch[t5];
        t6 = t6 + 1;
        t5 = t5 + 1;
      }
      t3 = ido + t3;
      t4 = iVar4 + t4;
    }
  }
  t3 = 0;
  iVar6 = ido * 2;
  t5 = 0;
  t6 = ip * iVar3;
  for (l = 1; l < iVar1; l = l + 1) {
    t3 = iVar6 + t3;
    t5 = iVar3 + t5;
    t6 = t6 - iVar3;
    t9 = t6;
    t8 = t5;
    t7 = t3;
    for (ic = 0; ic < l1; ic = ic + 1) {
      cc[t7 + -1] = ch[t8];
      cc[t7] = ch[t9];
      t7 = iVar4 + t7;
      t8 = ido + t8;
      t9 = ido + t9;
    }
  }
  if (ido != 1) {
    if (iVar2 < l1) {
      t3 = -ido;
      t5 = 0;
      t6 = 0;
      t7 = ip * iVar3;
      for (l = 1; l < iVar1; l = l + 1) {
        t3 = iVar6 + t3;
        t5 = iVar6 + t5;
        t6 = iVar3 + t6;
        t7 = t7 - iVar3;
        for (k = 2; k < ido; k = k + 2) {
          t8 = (ido + t3) - k;
          t9 = k + t5;
          t10 = k + t6;
          dc2 = (float)(k + t7);
          for (ic = 0; ic < l1; ic = ic + 1) {
            cc[t9 + -1] = ch[t10 + -1] + ch[(int)dc2 + -1];
            cc[t8 + -1] = ch[t10 + -1] - ch[(int)dc2 + -1];
            cc[t9] = ch[t10] + ch[(int)dc2];
            cc[t8] = ch[(int)dc2] - ch[t10];
            t8 = iVar4 + t8;
            t9 = iVar4 + t9;
            t10 = ido + t10;
            dc2 = (float)(ido + (int)dc2);
          }
        }
      }
    }
    else {
      t3 = -ido;
      t5 = 0;
      t6 = 0;
      t7 = ip * iVar3;
      for (l = 1; l < iVar1; l = l + 1) {
        t3 = iVar6 + t3;
        t5 = iVar6 + t5;
        t6 = iVar3 + t6;
        t7 = t7 - iVar3;
        dc2 = (float)t7;
        t10 = t6;
        t9 = t5;
        t8 = t3;
        for (ic = 0; ic < l1; ic = ic + 1) {
          for (k = 2; k < ido; k = k + 2) {
            cc[k + t9 + -1] = ch[k + t10 + -1] + ch[k + (int)dc2 + -1];
            cc[(ido - k) + t8 + -1] = ch[k + t10 + -1] - ch[k + (int)dc2 + -1];
            cc[k + t9] = ch[k + t10] + ch[k + (int)dc2];
            cc[(ido - k) + t8] = ch[k + (int)dc2] - ch[k + t10];
          }
          t8 = iVar4 + t8;
          t9 = iVar4 + t9;
          t10 = ido + t10;
          dc2 = (float)(ido + (int)dc2);
        }
      }
    }
  }
  return;
}

Assistant:

static void dradfg(int ido,int ip,int l1,int idl1,float *cc,float *c1,
                          float *c2,float *ch,float *ch2,float *wa){

  static float tpi=6.283185307179586f;
  int idij,ipph,i,j,k,l,ic,ik,is;
  int t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10;
  float dc2,ai1,ai2,ar1,ar2,ds2;
  int nbd;
  float dcp,arg,dsp,ar1h,ar2h;
  int idp2,ipp2;

  arg=tpi/(float)ip;
  dcp=cos(arg);
  dsp=sin(arg);
  ipph=(ip+1)>>1;
  ipp2=ip;
  idp2=ido;
  nbd=(ido-1)>>1;
  t0=l1*ido;
  t10=ip*ido;

  if(ido==1)goto L119;
  for(ik=0;ik<idl1;ik++)ch2[ik]=c2[ik];

  t1=0;
  for(j=1;j<ip;j++){
    t1+=t0;
    t2=t1;
    for(k=0;k<l1;k++){
      ch[t2]=c1[t2];
      t2+=ido;
    }
  }

  is=-ido;
  t1=0;
  if(nbd>l1){
    for(j=1;j<ip;j++){
      t1+=t0;
      is+=ido;
      t2= -ido+t1;
      for(k=0;k<l1;k++){
        idij=is-1;
        t2+=ido;
        t3=t2;
        for(i=2;i<ido;i+=2){
          idij+=2;
          t3+=2;
          ch[t3-1]=wa[idij-1]*c1[t3-1]+wa[idij]*c1[t3];
          ch[t3]=wa[idij-1]*c1[t3]-wa[idij]*c1[t3-1];
        }
      }
    }
  }else{

    for(j=1;j<ip;j++){
      is+=ido;
      idij=is-1;
      t1+=t0;
      t2=t1;
      for(i=2;i<ido;i+=2){
        idij+=2;
        t2+=2;
        t3=t2;
        for(k=0;k<l1;k++){
          ch[t3-1]=wa[idij-1]*c1[t3-1]+wa[idij]*c1[t3];
          ch[t3]=wa[idij-1]*c1[t3]-wa[idij]*c1[t3-1];
          t3+=ido;
        }
      }
    }
  }

  t1=0;
  t2=ipp2*t0;
  if(nbd<l1){
    for(j=1;j<ipph;j++){
      t1+=t0;
      t2-=t0;
      t3=t1;
      t4=t2;
      for(i=2;i<ido;i+=2){
        t3+=2;
        t4+=2;
        t5=t3-ido;
        t6=t4-ido;
        for(k=0;k<l1;k++){
          t5+=ido;
          t6+=ido;
          c1[t5-1]=ch[t5-1]+ch[t6-1];
          c1[t6-1]=ch[t5]-ch[t6];
          c1[t5]=ch[t5]+ch[t6];
          c1[t6]=ch[t6-1]-ch[t5-1];
        }
      }
    }
  }else{
    for(j=1;j<ipph;j++){
      t1+=t0;
      t2-=t0;
      t3=t1;
      t4=t2;
      for(k=0;k<l1;k++){
        t5=t3;
        t6=t4;
        for(i=2;i<ido;i+=2){
          t5+=2;
          t6+=2;
          c1[t5-1]=ch[t5-1]+ch[t6-1];
          c1[t6-1]=ch[t5]-ch[t6];
          c1[t5]=ch[t5]+ch[t6];
          c1[t6]=ch[t6-1]-ch[t5-1];
        }
        t3+=ido;
        t4+=ido;
      }
    }
  }

L119:
  for(ik=0;ik<idl1;ik++)c2[ik]=ch2[ik];

  t1=0;
  t2=ipp2*idl1;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1-ido;
    t4=t2-ido;
    for(k=0;k<l1;k++){
      t3+=ido;
      t4+=ido;
      c1[t3]=ch[t3]+ch[t4];
      c1[t4]=ch[t4]-ch[t3];
    }
  }

  ar1=1.f;
  ai1=0.f;
  t1=0;
  t2=ipp2*idl1;
  t3=(ip-1)*idl1;
  for(l=1;l<ipph;l++){
    t1+=idl1;
    t2-=idl1;
    ar1h=dcp*ar1-dsp*ai1;
    ai1=dcp*ai1+dsp*ar1;
    ar1=ar1h;
    t4=t1;
    t5=t2;
    t6=t3;
    t7=idl1;

    for(ik=0;ik<idl1;ik++){
      ch2[t4++]=c2[ik]+ar1*c2[t7++];
      ch2[t5++]=ai1*c2[t6++];
    }

    dc2=ar1;
    ds2=ai1;
    ar2=ar1;
    ai2=ai1;

    t4=idl1;
    t5=(ipp2-1)*idl1;
    for(j=2;j<ipph;j++){
      t4+=idl1;
      t5-=idl1;

      ar2h=dc2*ar2-ds2*ai2;
      ai2=dc2*ai2+ds2*ar2;
      ar2=ar2h;

      t6=t1;
      t7=t2;
      t8=t4;
      t9=t5;
      for(ik=0;ik<idl1;ik++){
        ch2[t6++]+=ar2*c2[t8++];
        ch2[t7++]+=ai2*c2[t9++];
      }
    }
  }

  t1=0;
  for(j=1;j<ipph;j++){
    t1+=idl1;
    t2=t1;
    for(ik=0;ik<idl1;ik++)ch2[ik]+=c2[t2++];
  }

  if(ido<l1)goto L132;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t4=t2;
    for(i=0;i<ido;i++)cc[t4++]=ch[t3++];
    t1+=ido;
    t2+=t10;
  }

  goto L135;

 L132:
  for(i=0;i<ido;i++){
    t1=i;
    t2=i;
    for(k=0;k<l1;k++){
      cc[t2]=ch[t1];
      t1+=ido;
      t2+=t10;
    }
  }

 L135:
  t1=0;
  t2=ido<<1;
  t3=0;
  t4=ipp2*t0;
  for(j=1;j<ipph;j++){

    t1+=t2;
    t3+=t0;
    t4-=t0;

    t5=t1;
    t6=t3;
    t7=t4;

    for(k=0;k<l1;k++){
      cc[t5-1]=ch[t6];
      cc[t5]=ch[t7];
      t5+=t10;
      t6+=ido;
      t7+=ido;
    }
  }

  if(ido==1)return;
  if(nbd<l1)goto L141;

  t1=-ido;
  t3=0;
  t4=0;
  t5=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t2;
    t3+=t2;
    t4+=t0;
    t5-=t0;
    t6=t1;
    t7=t3;
    t8=t4;
    t9=t5;
    for(k=0;k<l1;k++){
      for(i=2;i<ido;i+=2){
        ic=idp2-i;
        cc[i+t7-1]=ch[i+t8-1]+ch[i+t9-1];
        cc[ic+t6-1]=ch[i+t8-1]-ch[i+t9-1];
        cc[i+t7]=ch[i+t8]+ch[i+t9];
        cc[ic+t6]=ch[i+t9]-ch[i+t8];
      }
      t6+=t10;
      t7+=t10;
      t8+=ido;
      t9+=ido;
    }
  }
  return;

 L141:

  t1=-ido;
  t3=0;
  t4=0;
  t5=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t2;
    t3+=t2;
    t4+=t0;
    t5-=t0;
    for(i=2;i<ido;i+=2){
      t6=idp2+t1-i;
      t7=i+t3;
      t8=i+t4;
      t9=i+t5;
      for(k=0;k<l1;k++){
        cc[t7-1]=ch[t8-1]+ch[t9-1];
        cc[t6-1]=ch[t8-1]-ch[t9-1];
        cc[t7]=ch[t8]+ch[t9];
        cc[t6]=ch[t9]-ch[t8];
        t6+=t10;
        t7+=t10;
        t8+=ido;
        t9+=ido;
      }
    }
  }
}